

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3IsReadOnly(Parse *pParse,Table *pTab,Trigger *pTrigger)

{
  sqlite3 *db;
  uint uVar1;
  VTable *pVVar2;
  char *pcVar3;
  u8 uVar4;
  char *zFormat;
  
  uVar4 = pTab->eTabType;
  if (uVar4 == '\x01') {
    db = pParse->db;
    pVVar2 = sqlite3GetVTable(db,pTab);
    if (pVVar2->pMod->pModule->xUpdate ==
        (_func_int_sqlite3_vtab_ptr_int_sqlite3_value_ptr_ptr_sqlite3_int64_ptr *)0x0) {
LAB_00183bf2:
      pcVar3 = pTab->zName;
      zFormat = "table %s may not be modified";
      goto LAB_00183c23;
    }
    if (pParse->pToplevel == (Parse *)0x0) {
      return 0;
    }
    if ((uint)((pTab->u).vtab.p)->eVtabRisk <= ((uint)db->flags >> 7 & 1)) {
      return 0;
    }
    sqlite3ErrorMsg(pParse,"unsafe use of virtual table \"%s\"",pTab->zName);
    uVar4 = pTab->eTabType;
  }
  else if ((pTab->tabFlags & 0x1001) != 0) {
    if ((pTab->tabFlags & 1) == 0) {
      uVar1 = sqlite3ReadOnlyShadowTables(pParse->db);
    }
    else {
      if ((pParse->db->flags & 0x10000001) == 1) goto LAB_00183bfe;
      uVar1 = (uint)(pParse->nested == '\0');
    }
    if (uVar1 != 0) goto LAB_00183bf2;
  }
LAB_00183bfe:
  if (uVar4 != '\x02') {
    return 0;
  }
  if (pTrigger != (Trigger *)0x0) {
    if (pTrigger->bReturning == '\0') {
      return 0;
    }
    if (pTrigger->pNext != (Trigger *)0x0) {
      return 0;
    }
  }
  pcVar3 = pTab->zName;
  zFormat = "cannot modify %s because it is a view";
LAB_00183c23:
  sqlite3ErrorMsg(pParse,zFormat,pcVar3);
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3IsReadOnly(Parse *pParse, Table *pTab, Trigger *pTrigger){
  if( tabIsReadOnly(pParse, pTab) ){
    sqlite3ErrorMsg(pParse, "table %s may not be modified", pTab->zName);
    return 1;
  }
#ifndef SQLITE_OMIT_VIEW
  if( IsView(pTab)
   && (pTrigger==0 || (pTrigger->bReturning && pTrigger->pNext==0))
  ){
    sqlite3ErrorMsg(pParse,"cannot modify %s because it is a view",pTab->zName);
    return 1;
  }
#endif
  return 0;
}